

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::
index_key_value<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
           *this,key_type *Name,int64_t Index,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args,semantic_tag *args_1)

{
  allocator<char> local_21;
  
  std::__cxx11::wstring::wstring((wstring *)this,(wstring *)Name);
  *(int64_t *)(this + 0x20) = Index;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)(this + 0x28),
             args->_M_str,args->_M_len,*args_1,&local_21);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }